

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  u8 *puVar3;
  char *pcVar4;
  u8 uVar5;
  ushort uVar6;
  u16 uVar7;
  uint uVar8;
  undefined8 uVar9;
  int iVar10;
  u32 uVar11;
  u32 uVar12;
  uint uVar13;
  ulong uVar14;
  u8 *pCell;
  ulong uVar15;
  
  puVar3 = pPage->aData;
  pcVar4 = pPage->pBt->pPager->pTmpSpace;
  uVar14 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar12 = pPage->pBt->usableSize;
  uVar6 = *(ushort *)(puVar3 + uVar14 + 5) << 8 | *(ushort *)(puVar3 + uVar14 + 5) >> 8;
  memcpy(pcVar4 + uVar6,puVar3 + uVar6,(long)(int)(uVar12 - uVar6));
  uVar8 = (uint)uVar1 + (uint)uVar2 * 2;
  if (uVar2 == 0) {
    uVar5 = (u8)(uVar12 >> 8);
  }
  else {
    uVar15 = 0;
    uVar11 = uVar12;
    do {
      uVar6 = *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) << 8 |
              *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) >> 8;
      uVar9 = 0xc5fa;
      if ((uVar6 < uVar8) ||
         (uVar13 = (uint)uVar6, uVar13 != uVar12 - 4 && (int)(uVar12 - 4) <= (int)(uint)uVar6))
      goto LAB_00144c1c;
      pCell = (u8 *)(pcVar4 + uVar13);
      uVar7 = cellSizePtr(pPage,pCell);
      uVar11 = uVar11 - uVar7;
      uVar9 = 0xc606;
      if (((int)uVar11 < (int)uVar8) || ((int)uVar12 < (int)(uVar13 + uVar7))) goto LAB_00144c1c;
      memcpy(puVar3 + uVar11,pCell,(ulong)uVar7);
      *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
    uVar5 = (u8)(uVar11 >> 8);
    uVar12 = uVar11;
  }
  puVar3[uVar14 + 5] = uVar5;
  puVar3[uVar14 + 6] = (u8)uVar12;
  (puVar3 + uVar14 + 1)[0] = '\0';
  (puVar3 + uVar14 + 1)[1] = '\0';
  puVar3[uVar14 + 7] = '\0';
  iVar10 = 0;
  memset(puVar3 + uVar8,0,(long)(int)(uVar12 - uVar8));
  uVar9 = 0xc617;
  if (uVar12 - uVar8 != (uint)pPage->nFree) {
LAB_00144c1c:
    iVar10 = 0xb;
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar9,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  return iVar10;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of a i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = get2byte(&data[hdr+5]);
  memcpy(&temp[cbrk], &data[cbrk], usableSize - cbrk);
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &temp[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    memcpy(&data[cbrk], &temp[pc], size);
    put2byte(pAddr, cbrk);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}